

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtaskqueue.h
# Opt level: O2

bool __thiscall
TaskQueue<std::shared_ptr<RenderTask>_>::pop
          (TaskQueue<std::shared_ptr<RenderTask>_> *this,shared_ptr<RenderTask> *task)

{
  __shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2> *__r;
  __shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  lock_t lock;
  unique_lock<std::mutex> local_40;
  
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->_mutex);
  while( true ) {
    __r = &((this->_q).
            super__Deque_base<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur)->
           super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>;
    p_Var1 = &((this->_q).
               super__Deque_base<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur)->
              super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>;
    if (p_Var1 != __r) break;
    if (this->_done != false) goto LAB_001391cd;
    std::condition_variable::wait((unique_lock *)&this->_ready);
  }
  std::__shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&task->super___shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>,__r);
  std::deque<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>::pop_front
            (&this->_q);
LAB_001391cd:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return p_Var1 != __r;
}

Assistant:

bool pop(Task &task)
    {
        lock_t lock{_mutex};
        while (_q.empty() && !_done) _ready.wait(lock);
        if (_q.empty()) return false;
        task = std::move(_q.front());
        _q.pop_front();
        return true;
    }